

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O3

void __thiscall iDynTree::XMLParser::XMLParserPimpl::XMLParserPimpl(XMLParserPimpl *this)

{
  (this->m_parsedTrace).c.
  super__Deque_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_parsedTrace).c.
  super__Deque_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->m_parsedTrace).c.
  super__Deque_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_parsedTrace).c.
  super__Deque_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_parsedTrace).c.
  super__Deque_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_parsedTrace).c.
  super__Deque_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_parsedTrace).c.
  super__Deque_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_parsedTrace).c.
  super__Deque_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_parsedTrace).c.
  super__Deque_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_parsedTrace).c.
  super__Deque_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ::_M_initialize_map((_Deque_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
                       *)&this->m_parsedTrace,0);
  (this->m_document).super___shared_ptr<iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_document).super___shared_ptr<iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->f_documentFactory).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->f_documentFactory)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->f_documentFactory).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->f_documentFactory).super__Function_base._M_functor + 8) = 0;
  (this->m_schemaLocation)._M_dataplus._M_p = (pointer)&(this->m_schemaLocation).field_2;
  (this->m_schemaLocation)._M_string_length = 0;
  (this->m_schemaLocation).field_2._M_local_buf[0] = '\0';
  memset(this,0,0x100);
  (this->m_packageDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_packageDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_packageDirs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_parserState).m_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_parserState).m_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_parserState).m_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_parserState).m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_parserState).m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_callbackHandler).initialized = 0xdeedbeaf;
  (this->m_callbackHandler).startElementNs = parserCallbackStartTag;
  (this->m_callbackHandler).endElementNs = parserCallbackEndTag;
  (this->m_callbackHandler).startDocument = parserCallbackStartDocument;
  (this->m_callbackHandler).endDocument = parserCallbackEndDocument;
  (this->m_callbackHandler).characters = parserCallbackCharacters;
  (this->m_callbackHandler).error = parserErrorMessageCallback;
  (this->m_callbackHandler).warning = parserWarningMessageCallback;
  return;
}

Assistant:

XMLParserPimpl() {
            // ???: SAX2 structure initialization is kept in PIMPL constructor
            // All the other initializations are left to the main class
            
            // xmlSAX2InitDefaultSAXHandler(&m_callbackHandler, 0);
            // xmlSAXVersion(&m_callbackHandler, 2);
            // TODO: check what init does as the program crashes in that case
            // I think it initialize some callbacks that are missing
            memset(&m_callbackHandler, 0, sizeof(xmlSAXHandler));
            m_callbackHandler.initialized = XML_SAX2_MAGIC;
            
            m_callbackHandler.startElementNs = &parserCallbackStartTag;
            m_callbackHandler.endElementNs = &parserCallbackEndTag;
            m_callbackHandler.startDocument = &parserCallbackStartDocument;
            m_callbackHandler.endDocument = &parserCallbackEndDocument;
            m_callbackHandler.characters = &parserCallbackCharacters;
            m_callbackHandler.error = &parserErrorMessageCallback;
            m_callbackHandler.warning = &parserWarningMessageCallback;

        }